

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O2

void __thiscall
S2RegionCoverer::ReplaceCellsWithAncestor
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *covering,S2CellId id)

{
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> _Var1;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> __last;
  S2LogMessage local_38;
  
  local_38._0_8_ = id.id_ - (~id.id_ & id.id_ - 1);
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId,__gnu_cxx::__ops::_Iter_less_val>
                    ((covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                     super__Vector_impl_data._M_finish,&local_38);
  local_38._0_8_ = id.id_ - 1 | id.id_;
  __last = std::
           __upper_bound<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>,S2CellId,__gnu_cxx::__ops::_Val_less_iter>
                     ((covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                      super__Vector_impl_data._M_start,
                      (covering->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                      super__Vector_impl_data._M_finish,&local_38);
  if (_Var1._M_current != __last._M_current) {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::erase
              (covering,_Var1._M_current + 1,(const_iterator)__last._M_current);
    (_Var1._M_current)->id_ = id.id_;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
             ,0x194,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_38.stream_,"Check failed: begin != end ");
  abort();
}

Assistant:

void S2RegionCoverer::ReplaceCellsWithAncestor(vector<S2CellId>* covering,
                                               S2CellId id) const {
  auto begin = std::lower_bound(covering->begin(), covering->end(),
                                id.range_min());
  auto end = std::upper_bound(covering->begin(), covering->end(),
                              id.range_max());
  S2_DCHECK(begin != end);
  covering->erase(begin + 1, end);
  *begin = id;
}